

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O1

int queue_segment_set_out(uint32_t field,uint32_t location,void *buffer,mixed_segment *segment)

{
  long *plVar1;
  int code;
  ulong uVar2;
  
  code = 7;
  if (field == 0) {
    plVar1 = (long *)segment->data;
    code = 6;
    if (location < *(uint *)(plVar1 + 3)) {
      *(void **)(plVar1[2] + (ulong)location * 8) = buffer;
      if ((int)plVar1[1] == 0) {
        return 1;
      }
      uVar2 = 0;
      do {
        mixed_segment_set_out(0,location,buffer,*(mixed_segment **)(*plVar1 + uVar2 * 8));
        uVar2 = uVar2 + 1;
      } while (uVar2 < *(uint *)(plVar1 + 1));
      return 1;
    }
  }
  mixed_err(code);
  return 0;
}

Assistant:

int queue_segment_set_out(uint32_t field, uint32_t location, void *buffer, struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;

  switch(field){
  case MIXED_BUFFER:
    if(location < data->out_count){
      data->out[location] = (struct mixed_buffer *)buffer;
      // Update existing segments in the queue.
      for(uint32_t i=0; i<data->count; ++i){
        mixed_segment_set_out(MIXED_BUFFER, location, buffer, data->queue[i]);
      }
      return 1;
    }
    mixed_err(MIXED_INVALID_LOCATION);
    return 0;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}